

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagTypes.cpp
# Opt level: O0

bool __thiscall JtagTAP_Controller::AdvanceState(JtagTAP_Controller *this,BitState tms_state)

{
  JtagTAPState JVar1;
  JtagTAPState local_18;
  bool ret_val;
  JtagTAPState new_state;
  BitState tms_state_local;
  JtagTAP_Controller *this_local;
  
  if (tms_state == BIT_HIGH) {
    local_18 = tap_state_change_map[this->mCurrTAPState].tms_high_change;
  }
  else {
    local_18 = tap_state_change_map[this->mCurrTAPState].tms_low_change;
  }
  JVar1 = this->mCurrTAPState;
  this->mCurrTAPState = local_18;
  return local_18 != JVar1;
}

Assistant:

bool JtagTAP_Controller::AdvanceState( BitState tms_state )
{
    JtagTAPState new_state;

    if( tms_state == BIT_HIGH )
        new_state = tap_state_change_map[ mCurrTAPState ].tms_high_change;
    else
        new_state = tap_state_change_map[ mCurrTAPState ].tms_low_change;

    bool ret_val = new_state != mCurrTAPState;

    mCurrTAPState = new_state;

    return ret_val;
}